

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

void __thiscall
pbrt::MIPMap::MIPMap
          (MIPMap *this,Image *image,RGBColorSpace *colorSpace,WrapMode wrapMode,Allocator alloc,
          MIPMapFilterOptions *options)

{
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *pvVar1;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar3;
  memory_resource *pmVar4;
  Image *pIVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  WrapMode2D local_f0;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> local_e8;
  Image local_c8;
  
  pmVar4 = pstd::pmr::new_delete_resource();
  (this->pyramid).alloc.memoryResource = pmVar4;
  (this->pyramid).nStored = 0;
  (this->pyramid).ptr = (Image *)0x0;
  (this->pyramid).nAlloc = 0;
  this->colorSpace = colorSpace;
  this->wrapMode = wrapMode;
  this->options = *options;
  if (colorSpace != (RGBColorSpace *)0x0) {
    Image::Image(&local_c8,image);
    WrapMode2D::WrapMode2D(&local_f0,wrapMode);
    Image::GeneratePyramid(&local_e8,&local_c8,local_f0,alloc);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
              (&this->pyramid,&local_e8);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::~vector(&local_e8);
    Image::~Image(&local_c8);
    pIVar5 = (this->pyramid).ptr;
    lVar7 = *(long *)(in_FS_OFFSET + -0x128);
    for (lVar6 = (this->pyramid).nStored * 0x98; lVar6 != 0; lVar6 = lVar6 + -0x98) {
      pvVar1 = &pIVar5->p16;
      pvVar2 = &pIVar5->p8;
      pvVar3 = &pIVar5->p32;
      pIVar5 = pIVar5 + 1;
      lVar7 = lVar7 + pvVar2->nStored + pvVar1->nStored * 2 + pvVar3->nStored * 4;
      *(long *)(in_FS_OFFSET + -0x128) = lVar7;
    }
    return;
  }
  LogFatal<char_const(&)[22]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
             ,0xc4,"Check failed: %s",(char (*) [22])0x5290de);
}

Assistant:

MIPMap::MIPMap(Image image, const RGBColorSpace *colorSpace, WrapMode wrapMode,
               Allocator alloc, const MIPMapFilterOptions &options)
    : colorSpace(colorSpace), wrapMode(wrapMode), options(options) {
    CHECK(colorSpace != nullptr);
    pyramid = Image::GeneratePyramid(std::move(image), wrapMode, alloc);
    std::for_each(pyramid.begin(), pyramid.end(),
                  [](const Image &im) { imageMapBytes += im.BytesUsed(); });
}